

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_store(CFL_CTX *cfl,uint8_t *input,int input_stride,int row,int col,TX_SIZE tx_size,
              int use_hbd)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint16_t *puVar7;
  cfl_subsample_hbd_fn p_Var8;
  cfl_subsample_lbd_fn p_Var9;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  uint16_t *recon_buf_q3;
  int store_width;
  int store_height;
  int store_col;
  int store_row;
  int sub_y;
  int sub_x;
  int tx_off_log2;
  int height;
  int width;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  TX_SIZE tx_size_00;
  
  bVar1 = (byte)*(undefined4 *)(in_RDI + 0x1094);
  iVar3 = in_ECX << (2 - bVar1 & 0x1f);
  bVar2 = (byte)*(undefined4 *)(in_RDI + 0x1090);
  iVar4 = in_R8D << (2 - bVar2 & 0x1f);
  iVar5 = tx_size_high[in_R9B] >> (bVar1 & 0x1f);
  iVar6 = tx_size_wide[in_R9B] >> (bVar2 & 0x1f);
  *(undefined4 *)(in_RDI + 0x108c) = 0;
  if ((in_R8D == 0) && (in_ECX == 0)) {
    *(int *)(in_RDI + 0x1088) = iVar6;
    *(int *)(in_RDI + 0x1084) = iVar5;
  }
  else {
    if (*(int *)(in_RDI + 0x1088) < iVar4 + iVar6) {
      in_stack_ffffffffffffffac = iVar4 + iVar6;
    }
    else {
      in_stack_ffffffffffffffac = *(int *)(in_RDI + 0x1088);
    }
    *(int *)(in_RDI + 0x1088) = in_stack_ffffffffffffffac;
    if (*(int *)(in_RDI + 0x1084) < iVar3 + iVar5) {
      in_stack_ffffffffffffffa8 = iVar3 + iVar5;
    }
    else {
      in_stack_ffffffffffffffa8 = *(int *)(in_RDI + 0x1084);
    }
    *(int *)(in_RDI + 0x1084) = in_stack_ffffffffffffffa8;
  }
  puVar7 = (uint16_t *)(in_RDI + (long)(iVar3 * 0x20 + iVar4) * 2);
  tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffffac >> 0x18);
  if ((int)recon_buf_q3 == 0) {
    p_Var9 = cfl_subsampling_lbd(tx_size_00,in_stack_ffffffffffffffa8,0);
    (*p_Var9)(in_RSI,in_EDX,puVar7);
  }
  else {
    p_Var8 = cfl_subsampling_hbd(tx_size_00,in_stack_ffffffffffffffa8,0);
    (*p_Var8)((uint16_t *)((long)in_RSI << 1),in_EDX,puVar7);
  }
  return;
}

Assistant:

static void cfl_store(CFL_CTX *cfl, const uint8_t *input, int input_stride,
                      int row, int col, TX_SIZE tx_size, int use_hbd) {
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const int tx_off_log2 = MI_SIZE_LOG2;
  const int sub_x = cfl->subsampling_x;
  const int sub_y = cfl->subsampling_y;
  const int store_row = row << (tx_off_log2 - sub_y);
  const int store_col = col << (tx_off_log2 - sub_x);
  const int store_height = height >> sub_y;
  const int store_width = width >> sub_x;

  // Invalidate current parameters
  cfl->are_parameters_computed = 0;

  // Store the surface of the pixel buffer that was written to, this way we
  // can manage chroma overrun (e.g. when the chroma surfaces goes beyond the
  // frame boundary)
  if (col == 0 && row == 0) {
    cfl->buf_width = store_width;
    cfl->buf_height = store_height;
  } else {
    cfl->buf_width = OD_MAXI(store_col + store_width, cfl->buf_width);
    cfl->buf_height = OD_MAXI(store_row + store_height, cfl->buf_height);
  }

  // Check that we will remain inside the pixel buffer.
  assert(store_row + store_height <= CFL_BUF_LINE);
  assert(store_col + store_width <= CFL_BUF_LINE);

  // Store the input into the CfL pixel buffer
  uint16_t *recon_buf_q3 =
      cfl->recon_buf_q3 + (store_row * CFL_BUF_LINE + store_col);
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    cfl_subsampling_hbd(tx_size, sub_x, sub_y)(CONVERT_TO_SHORTPTR(input),
                                               input_stride, recon_buf_q3);
  } else {
    cfl_subsampling_lbd(tx_size, sub_x, sub_y)(input, input_stride,
                                               recon_buf_q3);
  }
#else
  (void)use_hbd;
  cfl_subsampling_lbd(tx_size, sub_x, sub_y)(input, input_stride, recon_buf_q3);
#endif
}